

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O2

void boost::detail::test_eq_impl<std::array<unsigned_long,1ul>,std::array<unsigned_long,1ul>>
               (char *expr1,char *expr2,char *file,int line,char *function,
               array<unsigned_long,_1UL> *t,array<unsigned_long,_1UL> *u)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = std::operator==(t,u);
  if (bVar1) {
    report_errors_remind();
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,file);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line);
  poVar2 = std::operator<<(poVar2,"): test \'");
  poVar2 = std::operator<<(poVar2,expr1);
  poVar2 = std::operator<<(poVar2," == ");
  poVar2 = std::operator<<(poVar2,expr2);
  poVar2 = std::operator<<(poVar2,"\' failed in function \'");
  poVar2 = std::operator<<(poVar2,function);
  poVar2 = std::operator<<(poVar2,"\': ");
  poVar2 = std::operator<<(poVar2,"\'");
  poVar2 = operator<<(poVar2,t);
  poVar2 = std::operator<<(poVar2,"\' != \'");
  poVar2 = operator<<(poVar2,u);
  poVar2 = std::operator<<(poVar2,"\'");
  std::endl<char,std::char_traits<char>>(poVar2);
  report_errors_remind();
  test_errors()::x = test_errors()::x + 1;
  return;
}

Assistant:

inline void test_eq_impl( char const * expr1, char const * expr2,
  char const * file, int line, char const * function, T const & t, U const & u )
{
    if( t == u )
    {
        report_errors_remind();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << t << "' != '" << u << "'" << std::endl;
        ++test_errors();
    }
}